

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O1

QList<QToolBar_*> *
findChildrenHelper<QToolBar*>(QList<QToolBar_*> *__return_storage_ptr__,QObject *o)

{
  long lVar1;
  QToolBar *pQVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  QToolBar *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(o + 8);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QToolBar **)0x0;
  (__return_storage_ptr__->d).size = 0;
  if (*(long *)(lVar1 + 0x28) != 0) {
    uVar3 = 0;
    do {
      pQVar2 = (QToolBar *)QMetaObject::cast((QObject *)&QToolBar::staticMetaObject);
      if (pQVar2 != (QToolBar *)0x0) {
        local_38 = pQVar2;
        QtPrivate::QPodArrayOps<QToolBar*>::emplace<QToolBar*&>
                  ((QPodArrayOps<QToolBar*> *)__return_storage_ptr__,
                   (__return_storage_ptr__->d).size,&local_38);
        QList<QToolBar_*>::end(__return_storage_ptr__);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < *(ulong *)(lVar1 + 0x28));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static QList<T> findChildrenHelper(const QObject *o)
{
    const QObjectList &list = o->children();
    QList<T> result;

    for (int i=0; i < list.size(); ++i) {
        if (T t = qobject_cast<T>(list[i])) {
            result.append(t);
        }
    }

    return result;
}